

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tifuhash.cpp
# Opt level: O3

void tifuhash_64(void *key,int len,uint32_t seed,void *out)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double local_28;
  
  if (seed == 0) {
    dVar4 = 0.14285714285714285;
    local_28 = 3.0;
  }
  else {
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,seed);
    dVar4 = 1.0 / auVar2._0_8_ + auVar2._0_8_;
    local_28 = pow(dVar4,0.3333333333333333);
    dVar4 = pow(dVar4,0.14285714285714285);
  }
  if (0 < len) {
    lVar3 = 0;
    dVar7 = 1.0;
    do {
      pbVar1 = (byte *)((long)key + lVar3);
      dVar8 = (double)lVar3;
      lVar3 = lVar3 + 1;
      dVar8 = ((double)*pbVar1 + 1.0 + dVar8) / dVar4;
      dVar4 = dVar7 / (dVar4 + (double)*pbVar1);
      dVar9 = dVar7 / dVar8;
      dVar7 = dVar8 + 1.0;
      local_28 = 1.0 / (local_28 + dVar9);
    } while (len != lVar3);
  }
  local_28 = local_28 * (dVar4 + 3.141592653589793);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar4 * (local_28 + 2.718281828459045);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_28;
  auVar2 = vinsertps_avx(auVar6,auVar5,0x4c);
  auVar5 = vinsertps_avx(auVar6,auVar5,0x1c);
  auVar2 = vpaddd_avx(auVar2,auVar5);
  *(long *)out = auVar2._0_8_;
  return;
}

Assistant:

void tifuhash_64 ( const void * key, int len,
                   uint32_t seed, void * out )
{
  const uint8_t * data = (const uint8_t *)key;
  uint8_t buf [16];
  double * state = (double*)buf;
  uint32_t * state32 = (uint32_t*)buf;
  double seed32 = (double)seed;

  setup( state, seed32 );
  round( data, len, state );

  uint32_t h[2];
  
  h[0] = state32[0] + state32[3];
  h[1] = state32[1] + state32[2];

  ((uint32_t*)out)[0] = h[0];
  ((uint32_t*)out)[1] = h[1];
}